

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASValue.cpp
# Opt level: O1

vector<ASValue_*,_std::allocator<ASValue_*>_> * __thiscall
ASValue::getOperandsWithOp2
          (vector<ASValue_*,_std::allocator<ASValue_*>_> *__return_storage_ptr__,ASValue *this)

{
  pointer *pppAVar1;
  iterator iVar2;
  ASOperand2 *this_00;
  ASValue *pAVar3;
  pointer ppAVar4;
  ASValue *local_50;
  vector<ASValue_*,_std::allocator<ASValue_*>_> local_48;
  
  (__return_storage_ptr__->super__Vector_base<ASValue_*,_std::allocator<ASValue_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<ASValue_*,_std::allocator<ASValue_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<ASValue_*,_std::allocator<ASValue_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<ASValue_*,_std::allocator<ASValue_*>_>::vector(&local_48,&this->_operands);
  ppAVar4 = local_48.super__Vector_base<ASValue_*,_std::allocator<ASValue_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (ppAVar4 ==
        local_48.super__Vector_base<ASValue_*,_std::allocator<ASValue_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if (local_48.super__Vector_base<ASValue_*,_std::allocator<ASValue_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<ASValue_*,_std::allocator<ASValue_*>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return __return_storage_ptr__;
    }
    if (*ppAVar4 == (ASValue *)0x0) {
      this_00 = (ASOperand2 *)0x0;
    }
    else {
      this_00 = (ASOperand2 *)__dynamic_cast(*ppAVar4,&typeinfo,&ASOperand2::typeinfo,0);
    }
    if (this_00 == (ASOperand2 *)0x0) {
      local_50 = (ASValue *)0x0;
      iVar2._M_current =
           (__return_storage_ptr__->super__Vector_base<ASValue_*,_std::allocator<ASValue_*>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<ASValue_*,_std::allocator<ASValue_*>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<ASValue*,std::allocator<ASValue*>>::_M_realloc_insert<ASValue*>
                  ((vector<ASValue*,std::allocator<ASValue*>> *)__return_storage_ptr__,iVar2,
                   &local_50);
      }
      else {
        *iVar2._M_current = (ASValue *)0x0;
LAB_0015516d:
        pppAVar1 = &(__return_storage_ptr__->
                    super__Vector_base<ASValue_*,_std::allocator<ASValue_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppAVar1 = *pppAVar1 + 1;
      }
    }
    else {
      pAVar3 = ASOperand2::getRm(this_00);
      if (pAVar3 != (ASValue *)0x0) {
        local_50 = ASOperand2::getRm(this_00);
        iVar2._M_current =
             (__return_storage_ptr__->super__Vector_base<ASValue_*,_std::allocator<ASValue_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->super__Vector_base<ASValue_*,_std::allocator<ASValue_*>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<ASValue*,std::allocator<ASValue*>>::_M_realloc_insert<ASValue*>
                    ((vector<ASValue*,std::allocator<ASValue*>> *)__return_storage_ptr__,iVar2,
                     &local_50);
        }
        else {
          *iVar2._M_current = local_50;
          pppAVar1 = &(__return_storage_ptr__->
                      super__Vector_base<ASValue_*,_std::allocator<ASValue_*>_>)._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppAVar1 = *pppAVar1 + 1;
        }
      }
      pAVar3 = ASOperand2::getRs(this_00);
      if (pAVar3 != (ASValue *)0x0) {
        local_50 = ASOperand2::getRs(this_00);
        iVar2._M_current =
             (__return_storage_ptr__->super__Vector_base<ASValue_*,_std::allocator<ASValue_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current !=
            (__return_storage_ptr__->super__Vector_base<ASValue_*,_std::allocator<ASValue_*>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          *iVar2._M_current = local_50;
          goto LAB_0015516d;
        }
        std::vector<ASValue*,std::allocator<ASValue*>>::_M_realloc_insert<ASValue*>
                  ((vector<ASValue*,std::allocator<ASValue*>> *)__return_storage_ptr__,iVar2,
                   &local_50);
      }
    }
    ppAVar4 = ppAVar4 + 1;
  } while( true );
}

Assistant:

std::vector<ASValue *> ASValue::getOperandsWithOp2() {
    std::vector<ASValue *> val;
    for (auto i : getOperands()) {
        if (auto op2 = dynamic_cast<ASOperand2 *>(i)) {
            if (op2->getRm()) {
                val.push_back(op2->getRm());
            }
            if (op2->getRs()) {
                val.push_back(op2->getRs());
            }
        } else {
            val.push_back(op2);
        }
    }
    return val;
}